

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cupdlp_solver.c
# Opt level: O1

termination_code
PDHG_Check_Primal_Infeasibility
          (CUPDLPwork *pdhg,cupdlp_float dPrimalInfeasObj,cupdlp_float dPrimalInfeasRes)

{
  termination_code tVar1;
  
  tVar1 = FEASIBLE;
  if ((0.0 < dPrimalInfeasObj) && (dPrimalInfeasRes < dPrimalInfeasObj * pdhg->resobj->dFeasTol)) {
    tVar1 = INFEASIBLE;
  }
  return tVar1;
}

Assistant:

termination_code PDHG_Check_Primal_Infeasibility(
    CUPDLPwork *pdhg, cupdlp_float dPrimalInfeasObj,
    cupdlp_float dPrimalInfeasRes) {
  CUPDLPresobj *resobj = pdhg->resobj;

  termination_code primalCode = FEASIBLE;

  if (dPrimalInfeasObj > 0.0) {
    if (dPrimalInfeasRes < resobj->dFeasTol * dPrimalInfeasObj)
      primalCode = INFEASIBLE;
  }

  return primalCode;
}